

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ratio.cpp
# Opt level: O2

string * __thiscall Ratio::toString_abi_cxx11_(string *__return_storage_ptr__,Ratio *this)

{
  pointer pPVar1;
  ostream *poVar2;
  PhyloTreeEdge *e;
  pointer pPVar3;
  PhyloTreeEdge *f;
  double dVar4;
  ostringstream ss;
  string local_1c8 [32];
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  pPVar1 = (this->eEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pPVar3 = (this->eEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
                _M_impl.super__Vector_impl_data._M_start; pPVar3 != pPVar1; pPVar3 = pPVar3 + 1) {
    (**(pPVar3->super_Bipartition)._vptr_Bipartition)(local_1c8,pPVar3);
    poVar2 = std::operator<<((ostream *)local_1a8,local_1c8);
    std::operator<<(poVar2," ");
    std::__cxx11::string::~string(local_1c8);
  }
  dVar4 = getELength(this);
  poVar2 = std::ostream::_M_insert<double>(dVar4);
  std::operator<<(poVar2," / ");
  dVar4 = getFLength(this);
  poVar2 = std::ostream::_M_insert<double>(dVar4);
  std::operator<<(poVar2," ");
  pPVar1 = (this->fEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pPVar3 = (this->fEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
                _M_impl.super__Vector_impl_data._M_start; pPVar3 != pPVar1; pPVar3 = pPVar3 + 1) {
    (**(pPVar3->super_Bipartition)._vptr_Bipartition)(local_1c8,pPVar3);
    poVar2 = std::operator<<((ostream *)local_1a8,local_1c8);
    std::operator<<(poVar2," ");
    std::__cxx11::string::~string(local_1c8);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

string Ratio::toString() {
    std::ostringstream ss;
    for (auto &e : eEdges) {
        ss << e.toString() << " ";
    }
    ss << getELength() << " / " << getFLength() << " ";
    for (auto &f : fEdges) {
        ss << f.toString() << " ";
    }

    return ss.str();
}